

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

void __thiscall slang::JsonWriter::startArray(JsonWriter *this)

{
  format_string<const_char_(&)[1],_int_&> fmt;
  
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"[","");
  if (this->pretty == true) {
    this->currentIndent = this->currentIndent + this->indentSize;
    fmt.str.size_ = 6;
    fmt.str.data_ = "\n{:{}}";
    FormatBuffer::format<char_const(&)[1],int&>
              ((this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,
               (char (*) [1])0x88e35c,&this->currentIndent);
    return;
  }
  return;
}

Assistant:

void JsonWriter::startArray() {
    buffer->append("[");
    if (pretty) {
        currentIndent += indentSize;
        buffer->format("\n{:{}}", "", currentIndent);
    }
}